

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O2

BBox<2> * Omega_h::find_bounding_box<2>(BBox<2> *__return_storage_ptr__,Reals *coords)

{
  Alloc *pAVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  Write<double> local_88;
  Write<double> local_78;
  double local_68;
  double dStack_60;
  double local_58;
  double adStack_50 [2];
  BBox<2> init;
  
  pAVar1 = (coords->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar4 = pAVar1->size;
  }
  else {
    sVar4 = (ulong)pAVar1 >> 3;
  }
  iVar2 = divide_no_remainder<int>((int)(sVar4 >> 3),2);
  for (lVar3 = 2; lVar3 != 4; lVar3 = lVar3 + 1) {
    adStack_50[lVar3] = 1.79769313486232e+308;
    init.min.super_Few<double,_2>.array_[lVar3] = -1.79769313486232e+308;
  }
  local_58 = init.max.super_Few<double,_2>.array_[0];
  adStack_50[0] = init.max.super_Few<double,_2>.array_[1];
  local_68 = init.min.super_Few<double,_2>.array_[0];
  dStack_60 = init.min.super_Few<double,_2>.array_[1];
  Write<double>::Write(&local_78,&coords->write_);
  Write<double>::Write(&local_88,&local_78);
  transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<2>,Omega_h::BBox<2>,Omega_h::UniteOp<2>>
            (__return_storage_ptr__,(Omega_h *)0x0,iVar2,&local_88,in_R8,in_R9,local_68._0_4_,
             dStack_60._0_4_,local_58._0_4_,adStack_50[0]._0_4_);
  Write<double>::~Write(&local_88);
  Write<double>::~Write(&local_78);
  return __return_storage_ptr__;
}

Assistant:

BBox<dim> find_bounding_box(Reals coords) {
  auto npts = divide_no_remainder(coords.size(), dim);
  BBox<dim> init;
  for (Int i = 0; i < dim; ++i) {
    init.min[i] = ArithTraits<Real>::max();
    init.max[i] = ArithTraits<Real>::min();
  }
  return transform_reduce(IntIterator(0), IntIterator(npts), init,
      UniteOp<dim>(), GetBBoxOp<dim>(coords));
}